

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::memNative16_func(void *data,uint32 size)

{
  uint16 *local_28;
  uint16 *words;
  uint8 *bytes;
  uint32 size_local;
  void *data_local;
  
  local_28 = (uint16 *)data;
  words = (uint16 *)data;
  bytes._4_4_ = size >> 1;
  while (bytes._4_4_ != 0) {
    *local_28 = *words;
    words = words + 1;
    local_28 = local_28 + 1;
    bytes._4_4_ = bytes._4_4_ - 1;
  }
  return;
}

Assistant:

void
memNative16_func(void *data, uint32 size)
{
	uint8 *bytes = (uint8*)data;
	uint16 *words = (uint16*)data;
	size >>= 1;
	while(size--){
		*words++ = (uint16)bytes[0] | (uint16)bytes[1]<<8;
		bytes += 2;
	}
}